

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.h
# Opt level: O0

void idx2::WriteStream(bitstream *Bs,bitstream *Src)

{
  int iVar1;
  buffer local_a8;
  undefined1 local_90 [8];
  buffer Dst;
  bitstream *Src_local;
  bitstream *Bs_local;
  int BytePos_1;
  int BytePos;
  
  *(u64 *)Bs->BitPtr = Bs->BitBuf;
  Bs->BitPtr = Bs->BitPtr + (int)((Bs->BitPos >> 3) + (uint)((Bs->BitPos & 7U) != 0));
  Bs->BitPos = 0;
  Bs->BitBuf = 0;
  *(u64 *)Src->BitPtr = Src->BitBuf;
  iVar1 = Src->BitPos >> 3;
  if (0 < iVar1) {
    Src->BitBuf = (Src->BitBuf >> 1) >> ((char)(iVar1 << 3) - 1U & 0x3f);
  }
  Src->BitPtr = Src->BitPtr + iVar1;
  Src->BitPos = Src->BitPos & 7;
  Dst.Alloc = (allocator *)Src;
  operator+((buffer *)local_90,&Bs->Stream,
            (i64)(Bs->BitPtr + ((long)((Bs->BitPos + 7) / 8) - (long)(Bs->Stream).Data)));
  local_a8.Data = (byte *)(Dst.Alloc)->_vptr_allocator;
  local_a8.Bytes =
       (long)Dst.Alloc[3]._vptr_allocator +
       ((long)((*(int *)&Dst.Alloc[5]._vptr_allocator + 7) / 8) - (long)(Dst.Alloc)->_vptr_allocator
       );
  local_a8.Alloc = (allocator *)Dst.Alloc[2]._vptr_allocator;
  MemCopy(&local_a8,(buffer *)local_90);
  Bs->BitPtr = Bs->BitPtr +
               (long)Dst.Alloc[3]._vptr_allocator +
               ((long)((*(int *)&Dst.Alloc[5]._vptr_allocator + 7) / 8) -
               (long)(Dst.Alloc)->_vptr_allocator);
  return;
}

Assistant:

inline void
WriteStream(bitstream* Bs, bitstream* Src)
{
  FlushAndMoveToNextByte(Bs);
  Flush(Src);
  buffer Dst = Bs->Stream + Size(*Bs);
  MemCopy(ToBuffer(*Src), &Dst);
  Bs->BitPtr += Size(*Src);
}